

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O1

bool __thiscall DLoadSaveMenu::MenuEvent(DLoadSaveMenu *this,int mkey,bool fromcontroller)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  
  switch(mkey) {
  case 0:
    if (SaveGames.Count < 2) {
      return true;
    }
    uVar5 = this->Selected;
    if (uVar5 == 0xffffffff) {
LAB_003329b8:
      iVar6 = this->TopItem;
      goto LAB_00332a0c;
    }
    uVar2 = SaveGames.Count;
    if (0 < (int)uVar5) {
      uVar2 = uVar5;
    }
    uVar2 = uVar2 - 1;
    break;
  case 1:
    if (SaveGames.Count < 2) {
      return true;
    }
    if (this->Selected == -1) goto LAB_003329b8;
    uVar5 = this->Selected + 1;
    uVar2 = 0;
    if (uVar5 < SaveGames.Count) {
      uVar2 = uVar5;
    }
    break;
  default:
    bVar1 = DListMenu::MenuEvent(&this->super_DListMenu,mkey,fromcontroller);
    return bVar1;
  case 4:
    if (SaveGames.Count < 2) {
      return true;
    }
    iVar3 = this->listboxRows;
    if (this->TopItem == 0) {
      iVar6 = SaveGames.Count - iVar3;
      this->TopItem = iVar6;
      if (this->Selected == -1) goto LAB_00332a10;
    }
    else {
      iVar4 = this->TopItem - iVar3;
      iVar6 = 0;
      if (0 < iVar4) {
        iVar6 = iVar4;
      }
      this->TopItem = iVar6;
      if (this->Selected < iVar3 + iVar6) goto LAB_00332a10;
    }
    goto LAB_00332a0c;
  case 5:
    if (SaveGames.Count < 2) {
      return true;
    }
    iVar3 = SaveGames.Count - this->listboxRows;
    if (iVar3 <= this->TopItem) {
      this->TopItem = 0;
      if (this->Selected != -1) {
        this->Selected = 0;
      }
      goto LAB_00332a10;
    }
    iVar6 = this->listboxRows + this->TopItem;
    if (iVar3 <= iVar6) {
      iVar6 = iVar3;
    }
    this->TopItem = iVar6;
    if (this->Selected == -1 || iVar6 <= this->Selected) goto LAB_00332a10;
LAB_00332a0c:
    this->Selected = iVar6;
    goto LAB_00332a10;
  case 6:
    return false;
  case 0xc:
    uVar2 = this->Selected;
    if (SaveGames.Count <= uVar2) {
      return true;
    }
    iVar6 = uVar2 - (*SaveGames.Array)->bNoDelete;
    remove((SaveGames.Array[(int)uVar2]->Filename).Chars);
    UnloadSaveData(this);
    iVar3 = RemoveSaveSlot(this,this->Selected);
    this->Selected = iVar3;
    ExtractSaveData(this,iVar3);
    iVar3 = -1;
    if ((LastSaved != iVar6) && (iVar3 = LastSaved, iVar6 < LastSaved)) {
      iVar3 = LastSaved + -1;
    }
    LastSaved = iVar3;
    if (LastAccessed == iVar6) {
      LastAccessed = -1;
      return true;
    }
    if (LastAccessed <= iVar6) {
      return true;
    }
    LastAccessed = LastAccessed + -1;
    return true;
  }
  this->Selected = uVar2;
  if ((int)uVar2 < this->TopItem) {
    this->TopItem = uVar2;
  }
  else if (this->TopItem + this->listboxRows <= (int)uVar2) {
    iVar6 = uVar2 - this->listboxRows;
    iVar3 = -1;
    if (-1 < iVar6) {
      iVar3 = iVar6;
    }
    this->TopItem = iVar3 + 1;
  }
LAB_00332a10:
  UnloadSaveData(this);
  ExtractSaveData(this,this->Selected);
  return true;
}

Assistant:

bool DLoadSaveMenu::MenuEvent (int mkey, bool fromcontroller)
{
	switch (mkey)
	{
	case MKEY_Up:
		if (SaveGames.Size() > 1)
		{
			if (Selected == -1) Selected = TopItem;
			else
			{
				if (--Selected < 0) Selected = SaveGames.Size()-1;
				if (Selected < TopItem) TopItem = Selected;
				else if (Selected >= TopItem + listboxRows) TopItem = MAX(0, Selected - listboxRows + 1);
			}
			UnloadSaveData ();
			ExtractSaveData (Selected);
		}
		return true;

	case MKEY_Down:
		if (SaveGames.Size() > 1)
		{
			if (Selected == -1) Selected = TopItem;
			else
			{
				if (unsigned(++Selected) >= SaveGames.Size()) Selected = 0;
				if (Selected < TopItem) TopItem = Selected;
				else if (Selected >= TopItem + listboxRows) TopItem = MAX(0, Selected - listboxRows + 1);
			}
			UnloadSaveData ();
			ExtractSaveData (Selected);
		}
		return true;

	case MKEY_PageDown:
		if (SaveGames.Size() > 1)
		{
			if (TopItem >= (int)SaveGames.Size() - listboxRows)
			{
				TopItem = 0;
				if (Selected != -1) Selected = 0;
			}
			else
			{
				TopItem = MIN<int>(TopItem + listboxRows, SaveGames.Size() - listboxRows);
				if (TopItem > Selected && Selected != -1) Selected = TopItem;
			}
			UnloadSaveData ();
			ExtractSaveData (Selected);
		}
		return true;

	case MKEY_PageUp:
		if (SaveGames.Size() > 1)
		{
			if (TopItem == 0)
			{
				TopItem = SaveGames.Size() - listboxRows;
				if (Selected != -1) Selected = TopItem;
			}
			else
			{
				TopItem = MAX(TopItem - listboxRows, 0);
				if (Selected >= TopItem + listboxRows) Selected = TopItem;
			}
			UnloadSaveData ();
			ExtractSaveData (Selected);
		}
		return true;

	case MKEY_Enter:
		return false;	// This event will be handled by the subclasses

	case MKEY_MBYes:
	{
		if ((unsigned)Selected < SaveGames.Size())
		{
			int listindex = SaveGames[0]->bNoDelete? Selected-1 : Selected;
			remove (SaveGames[Selected]->Filename.GetChars());
			UnloadSaveData ();
			Selected = RemoveSaveSlot (Selected);
			ExtractSaveData (Selected);

			if (LastSaved == listindex) LastSaved = -1;
			else if (LastSaved > listindex) LastSaved--;
			if (LastAccessed == listindex) LastAccessed = -1;
			else if (LastAccessed > listindex) LastAccessed--;
		}
		return true;
	}

	default:
		return Super::MenuEvent(mkey, fromcontroller);
	}
}